

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-open.c
# Opt level: O0

hd_stream * hd_open_file_ptr(hd_context *ctx,FILE *file)

{
  undefined8 *state_00;
  hd_stream *phVar1;
  hd_file_stream *state;
  hd_stream *stm;
  FILE *file_local;
  hd_context *ctx_local;
  
  state_00 = (undefined8 *)hd_calloc(ctx,1,0x1008);
  *state_00 = file;
  phVar1 = hd_new_stream(ctx,state_00,next_file,close_file);
  phVar1->seek = seek_file;
  return phVar1;
}

Assistant:

hd_stream *
hd_open_file_ptr(hd_context *ctx, FILE *file)
{
    hd_stream *stm;
    hd_file_stream *state = hd_malloc_struct(ctx, hd_file_stream);
    state->file = file;

    stm = hd_new_stream(ctx, state, next_file, close_file);
    stm->seek = seek_file;

    return stm;
}